

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
r_comp::Compiler::set_arity_error(Compiler *this,Ptr *node,uint16_t expected,uint16_t got)

{
  shared_ptr<r_comp::RepliStruct> local_120;
  __cxx11 local_110 [48];
  __cxx11 local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  uint16_t local_1c;
  uint16_t local_1a;
  uint16_t got_local;
  Ptr *pPStack_18;
  uint16_t expected_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_1c = got;
  local_1a = expected;
  pPStack_18 = node;
  node_local = (Ptr *)this;
  std::__cxx11::to_string(local_e0,(uint)got);
  std::operator+((char *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ca7eb);
  std::operator+(local_a0,(char *)local_c0);
  std::__cxx11::to_string(local_110,(uint)local_1a);
  std::operator+(local_80,local_a0);
  std::operator+(local_60,(char *)local_80);
  std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  std::operator+(local_40,local_60);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_120,node);
  set_error(this,local_40,&local_120);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_120);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void Compiler::set_arity_error(RepliStruct::Ptr node, uint16_t expected, uint16_t got)
{
    set_error("got " + std::to_string(got) +
              " elements, expected " + std::to_string(expected) +
              " for " + node->cmd, node);
}